

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::PopAndCheck3Types
          (TypeChecker *this,Type expected1,Type expected2,Type expected3,char *desc)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Enum EVar4;
  Enum EVar5;
  bool bVar6;
  bool bVar7;
  Type actual;
  Type local_58;
  Type local_50;
  Type local_48;
  Type local_40;
  char *local_38;
  
  local_58.enum_ = Any;
  local_58.type_index_ = 0;
  local_48 = expected1;
  local_38 = desc;
  RVar1 = PeekType(this,0,&local_58);
  EVar4 = local_58.enum_;
  bVar6 = local_58 != expected3;
  local_58.enum_ = Any;
  local_58.type_index_ = 0;
  local_40 = expected3;
  RVar2 = PeekType(this,1,&local_58);
  EVar5 = local_58.enum_;
  bVar7 = local_58 != expected2;
  local_58.enum_ = Any;
  local_58.type_index_ = 0;
  local_50 = expected2;
  RVar3 = PeekType(this,2,&local_58);
  bVar6 = ((RVar3.enum_ == Error || bVar7 && (EVar5 != Any && expected2.enum_ != Any)) ||
          ((RVar2.enum_ == Error || RVar1.enum_ == Error) ||
          bVar6 && (EVar4 != Any && expected3.enum_ != Any))) ||
          local_58 != local_48 && (local_58.enum_ != Any && local_48.enum_ != Any);
  RVar1.enum_._1_3_ = 0;
  RVar1.enum_._0_1_ = bVar6;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
            (this,RVar1,local_38,local_48,local_50,local_40);
  RVar1 = DropTypes(this,3);
  return (Result)(uint)(bVar6 || RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::PopAndCheck3Types(Type expected1,
                                      Type expected2,
                                      Type expected3,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected3);
  result |= PeekAndCheckType(1, expected2);
  result |= PeekAndCheckType(2, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2, expected3);
  result |= DropTypes(3);
  return result;
}